

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

Expression * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,QualifiedIdentifier *o)

{
  bool bVar1;
  reference pPVar2;
  PathSection *p;
  iterator __end2;
  iterator __begin2;
  vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  *__range2;
  QualifiedIdentifier *o_local;
  RewritingASTVisitor *this_local;
  
  __end2 = std::
           vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
           ::begin(&o->pathSections);
  p = (PathSection *)
      std::
      vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
      ::end(&o->pathSections);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::AST::QualifiedIdentifier::PathSection_*,_std::vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>_>
                                *)&p);
    if (!bVar1) break;
    pPVar2 = __gnu_cxx::
             __normal_iterator<soul::AST::QualifiedIdentifier::PathSection_*,_std::vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>_>
             ::operator*(&__end2);
    replaceExpression(this,&pPVar2->specialisationArgs);
    __gnu_cxx::
    __normal_iterator<soul::AST::QualifiedIdentifier::PathSection_*,_std::vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>_>
    ::operator++(&__end2);
  }
  return &o->super_Expression;
}

Assistant:

virtual AST::Expression& visit (AST::QualifiedIdentifier& o)
    {
        for (auto& p : o.pathSections)
            replaceExpression (p.specialisationArgs);

        return o;
    }